

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week8-midterm.cpp
# Opt level: O3

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
* transform<std::__cxx11::string,std::vector<Employee,std::allocator<Employee>>,main::__3>
            (undefined1 *__return_storage_ptr__,long container)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *p_Var3;
  mapped_type *pmVar4;
  _Rb_tree_node_base *p_Var5;
  _Base_ptr p_Var6;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *extraout_RAX;
  _Rb_tree_color _Var7;
  _Base_ptr p_Var8;
  mapped_type mVar9;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  pair;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  local_98;
  undefined1 *local_60;
  key_type local_58;
  mapped_type local_38;
  
  local_98._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_98._M_impl.super__Rb_tree_header._M_header;
  local_98._M_impl._0_8_ = 0;
  local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var5 = *(_Rb_tree_node_base **)(container + 0x18);
  local_98._M_impl.super__Rb_tree_header._M_header._M_right =
       local_98._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var5 == (_Rb_tree_node_base *)(container + 8)) {
    p_Var6 = (_Base_ptr)(__return_storage_ptr__ + 8);
  }
  else {
    local_60 = __return_storage_ptr__;
    do {
      p_Var6 = p_Var5[2]._M_parent;
      lVar2 = *(long *)(p_Var5 + 2);
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,*(long *)(p_Var5 + 1),
                 (long)&(p_Var5[1]._M_parent)->_M_color + *(long *)(p_Var5 + 1));
      mVar9 = ((long)p_Var6 - lVar2 >> 4) * -0x5555555555555555;
      local_38 = mVar9;
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                             *)&local_98,&local_58);
      *pmVar4 = mVar9;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
    } while (p_Var5 != (_Rb_tree_node_base *)(container + 8));
    p_Var6 = (_Base_ptr)(local_60 + 8);
    __return_storage_ptr__ = local_60;
    if (local_98._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
      *(_Base_ptr *)(local_60 + 0x10) = local_98._M_impl.super__Rb_tree_header._M_header._M_parent;
      (local_98._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = p_Var6;
      *(size_t *)(local_60 + 0x28) = local_98._M_impl.super__Rb_tree_header._M_node_count;
      local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      p_Var1 = &local_98._M_impl.super__Rb_tree_header;
      p_Var6 = local_98._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var8 = local_98._M_impl.super__Rb_tree_header._M_header._M_right;
      _Var7 = local_98._M_impl.super__Rb_tree_header._M_header._M_color;
      p_Var3 = &local_98;
      local_98._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      local_98._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      goto LAB_00105274;
    }
  }
  *(undefined8 *)(__return_storage_ptr__ + 0x10) = 0;
  _Var7 = _S_red;
  p_Var8 = p_Var6;
  p_Var3 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
            *)__return_storage_ptr__;
LAB_00105274:
  *(_Base_ptr *)(__return_storage_ptr__ + 0x18) = p_Var6;
  *(_Base_ptr *)(__return_storage_ptr__ + 0x20) = p_Var8;
  *(undefined8 *)((long)p_Var3 + 0x28) = 0;
  *(_Rb_tree_color *)(__return_storage_ptr__ + 8) = _Var7;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~_Rb_tree(&local_98);
  return extraout_RAX;
}

Assistant:

auto transform(const std::map<Key, Value>& container, Func func)
{
    using Pair = decltype(func(*container.begin()));
    using NewKey = decltype(Pair().first);
    using NewValue = decltype(Pair().second);

    auto c = std::map<NewKey, NewValue>();
    for(const auto& item : container)
    {
        auto pair = func(item);
        c[pair.first] = pair.second;
    }
    return c;
}